

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_properties.cpp
# Opt level: O2

bool CheckDeprecatedFlags(AActor *actor,PClassActor *info,int index)

{
  PClass *pPVar1;
  double *pdVar2;
  PClass *pPVar3;
  bool bVar4;
  byte bVar5;
  double dVar6;
  FName local_c;
  
  switch(index) {
  case 1:
    bVar4 = (actor->DamageType).super_FName.Index == 0xa4;
    break;
  case 2:
    bVar4 = (actor->DamageType).super_FName.Index == 0x33;
    break;
  case 3:
    dVar6 = 0.125;
    goto LAB_00503582;
  case 4:
    bVar5 = -(actor->meleethreshold == 196.0);
    goto LAB_0050358b;
  case 5:
    bVar5 = -(actor->maxtargetrange == 896.0);
    goto LAB_0050358b;
  case 6:
    pPVar1 = (PClass *)actor[1].super_DThinker.PrevThinker;
    pPVar3 = PClass::FindClass("PickupFlash");
    bVar4 = pPVar1 == pPVar3;
    break;
  case 7:
    dVar6 = 0.25;
LAB_00503582:
    bVar5 = -(dVar6 == actor->Gravity);
LAB_0050358b:
    bVar4 = (bool)(bVar5 & 1);
    break;
  case 8:
    if (&info->DamageFactors->super_TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_>
        != (TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_> *)0x0) {
      local_c.Index = 0xa4;
      pdVar2 = TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_>::CheckKey
                         (&info->DamageFactors->
                           super_TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_>,
                          &local_c);
      if (pdVar2 != (double *)0x0) {
        bVar5 = -(*pdVar2 == 0.5);
        goto LAB_0050358b;
      }
    }
  default:
    bVar4 = false;
    break;
  case 9:
    bVar4 = ((actor->BounceFlags).Value & 0x10ef) == 0xc6;
    break;
  case 10:
    bVar4 = ((actor->BounceFlags).Value & 0x10ef) == 0x8f;
    break;
  case 0xb:
    bVar4 = ((actor->BounceFlags).Value & 0x10ef) == 0xaf;
    break;
  case 0xc:
    bVar4 = *(int *)&actor[1].super_DThinker.super_DObject.ObjNext == 0;
  }
  return bVar4;
}

Assistant:

bool CheckDeprecatedFlags(const AActor *actor, PClassActor *info, int index)
{
	// A deprecated flag is false if
	// a) it hasn't been added here
	// b) any property of the actor differs from what it would be after setting the flag using HandleDeprecatedFlags

	// Deprecated flags are normally replaced by something more flexible, which means a multitude of related configurations
	// will report "false".

	switch (index)
	{
	case DEPF_FIREDAMAGE:
		return actor->DamageType == NAME_Fire;
	case DEPF_ICEDAMAGE:
		return actor->DamageType == NAME_Ice;
	case DEPF_LOWGRAVITY:
		return actor->Gravity == 1./8;
	case DEPF_SHORTMISSILERANGE:
		return actor->maxtargetrange == 896.;
	case DEPF_LONGMELEERANGE:
		return actor->meleethreshold == 196.;
	case DEPF_QUARTERGRAVITY:
		return actor->Gravity == 1./4;
	case DEPF_FIRERESIST:
		if (info->DamageFactors)
		{
			double *df = info->DamageFactors->CheckKey(NAME_Fire);
			return df && (*df) == 0.5;
		}
		return false;

	case DEPF_HERETICBOUNCE:
		return (actor->BounceFlags & (BOUNCE_TypeMask|BOUNCE_UseSeeSound)) == BOUNCE_HereticCompat;

	case DEPF_HEXENBOUNCE:
		return (actor->BounceFlags & (BOUNCE_TypeMask|BOUNCE_UseSeeSound)) == BOUNCE_HexenCompat;
	
	case DEPF_DOOMBOUNCE:
		return (actor->BounceFlags & (BOUNCE_TypeMask|BOUNCE_UseSeeSound)) == BOUNCE_DoomCompat;

	case DEPF_PICKUPFLASH:
		return static_cast<const AInventory*>(actor)->PickupFlash == PClass::FindClass("PickupFlash");
		// A pure name lookup may or may not be more efficient, but I know no static identifier for PickupFlash.

	case DEPF_INTERHUBSTRIP:
		return !(static_cast<const AInventory*>(actor)->InterHubAmount);
	}

	return false; // Any entirely unknown flag is not set
}